

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

void __thiscall Hpipe::Instruction::update_in_a_branch(Instruction *this)

{
  bool bVar1;
  reference ppIVar2;
  size_type sVar3;
  Transition *pTVar4;
  Instruction *local_88;
  Instruction *inst_1;
  Instruction *inst;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::Instruction_*> *__range1;
  anon_class_8_1_a8aa4543 local_50;
  function<void_(Hpipe::Instruction_*)> local_48;
  undefined1 local_28 [8];
  Vec<Hpipe::Instruction_*> tails;
  Instruction *this_local;
  
  tails.super_vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>.
  super__Vector_base<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Vec<Hpipe::Instruction_*>::Vec((Vec<Hpipe::Instruction_*> *)local_28);
  local_50.tails = (Vec<Hpipe::Instruction_*> *)local_28;
  std::function<void(Hpipe::Instruction*)>::
  function<Hpipe::Instruction::update_in_a_branch()::__0,void>
            ((function<void(Hpipe::Instruction*)> *)&local_48,&local_50);
  apply(this,&local_48,false);
  std::function<void_(Hpipe::Instruction_*)>::~function(&local_48);
  __end1 = std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>::begin
                     ((vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_> *)
                      local_28);
  inst = (Instruction *)
         std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>::end
                   ((vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_> *)local_28)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Hpipe::Instruction_**,_std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>_>
                                     *)&inst), local_88 = this, bVar1) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<Hpipe::Instruction_**,_std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>_>
              ::operator*(&__end1);
    inst_1 = *ppIVar2;
    while ((inst_1->in_a_branch & 1U) != 0) {
      inst_1->in_a_branch = false;
      sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                        (&(inst_1->prev).
                          super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
      if (sVar3 != 1) break;
      pTVar4 = Vec<Hpipe::Transition>::operator[](&inst_1->prev,0);
      inst_1 = pTVar4->inst;
    }
    __gnu_cxx::
    __normal_iterator<Hpipe::Instruction_**,_std::vector<Hpipe::Instruction_*,_std::allocator<Hpipe::Instruction_*>_>_>
    ::operator++(&__end1);
  }
  while ((local_88->in_a_branch & 1U) != 0) {
    local_88->in_a_branch = false;
    sVar3 = std::vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>::size
                      (&(local_88->next).
                        super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>);
    if (sVar3 != 1) break;
    pTVar4 = Vec<Hpipe::Transition>::operator[](&local_88->next,0);
    local_88 = pTVar4->inst;
  }
  Vec<Hpipe::Instruction_*>::~Vec((Vec<Hpipe::Instruction_*> *)local_28);
  return;
}

Assistant:

void Instruction::update_in_a_branch() {
    Vec<Instruction *> tails;
    apply( [&]( Instruction *inst ) {
        inst->in_a_branch = true;
        if ( inst->next.empty() )
            tails << inst;
    } );

    // tails
    for( Instruction *inst : tails ) {
        while( true ) {
            if ( inst->in_a_branch == false )
                break;
            inst->in_a_branch = false;
            if ( inst->prev.size() != 1 )
                break;
            inst = inst->prev[ 0 ].inst;
        }
    }

    // head
    for( Instruction *inst = this; ; ) {
        if ( inst->in_a_branch == false )
            break;
        inst->in_a_branch = false;
        if ( inst->next.size() != 1 )
            break;
        inst = inst->next[ 0 ].inst;
    }
}